

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeaveScriptObject.cpp
# Opt level: O0

void __thiscall Js::EnterScriptObject::~EnterScriptObject(EnterScriptObject *this)

{
  ThreadContext *pTVar1;
  EnterScriptObject *this_local;
  
  ScriptContext::OnScriptEnd
            (this->scriptContext,(bool)(this->isCallRoot & 1),(bool)(this->hasForcedEnter & 1));
  if (-1 < this->hr) {
    pTVar1 = ScriptContext::GetThreadContext(this->scriptContext);
    ThreadContext::PopHostScriptContext(pTVar1);
  }
  pTVar1 = ScriptContext::GetThreadContext(this->scriptContext);
  ThreadContext::EnterScriptEnd(pTVar1,this->entryExitRecord,(bool)(this->doCleanup & 1));
  ScriptContext::ProfileEnd(this->scriptContext,RunPhase);
  return;
}

Assistant:

EnterScriptObject::~EnterScriptObject()
    {
        scriptContext->OnScriptEnd(isCallRoot, hasForcedEnter);
        if (SUCCEEDED(hr))
        {
            scriptContext->GetThreadContext()->PopHostScriptContext();
        }
        scriptContext->GetThreadContext()->EnterScriptEnd(entryExitRecord, doCleanup);
#ifdef PROFILE_EXEC
        scriptContext->ProfileEnd(Js::RunPhase);
#endif
    }